

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O1

void ZXing::DataMatrix::C40Encoder::EncodeC40
               (EncoderContext *context,
               function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *encodeChar,int encodingMode)

{
  byte bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  SymbolInfo *pSVar5;
  logic_error *this;
  int len;
  int iVar6;
  string buffer;
  string removed;
  string local_c0;
  _Any_data *local_a0;
  int local_98;
  int local_94;
  string local_90;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_a0 = (_Any_data *)encodeChar;
  local_98 = encodingMode;
  do {
    iVar4 = context->_pos;
    uVar2 = (context->_msg)._M_string_length;
    if ((int)uVar2 - context->_skipAtEnd <= iVar4) break;
    if (uVar2 <= (ulong)(long)iVar4) {
LAB_0015853f:
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar1 = (context->_msg)._M_dataplus._M_p[iVar4];
    context->_pos = iVar4 + 1;
    local_90._M_dataplus._M_p._0_4_ = (uint)bVar1;
    if (*(long *)(local_a0 + 1) == 0) {
      std::__throw_bad_function_call();
      goto LAB_0015853f;
    }
    iVar4 = (**(code **)(local_a0->_M_pod_data + 0x18))(local_a0,(int *)&local_90,&local_c0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_c0._M_string_length;
    len = (*(int *)&(context->_codewords).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(context->_codewords).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                   .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) +
          (SUB164(ZEXT816(0xaaaaaaaaaaaaaaab) * auVar3,8) & 0xfffffffe);
    pSVar5 = EncoderContext::updateSymbolInfo(context,len);
    iVar6 = local_98;
    if (context->_pos < (int)(context->_msg)._M_string_length - context->_skipAtEnd) {
      if ((local_c0._M_string_length * -0x5555555555555555 < 0x5555555555555556) &&
         (iVar4 = LookAheadTest(&context->_msg,(long)context->_pos,local_98), iVar4 != iVar6)) {
        context->_newEncoding = 0;
        iVar4 = 3;
      }
      else {
        iVar4 = 0;
      }
    }
    else {
      local_94 = pSVar5->_dataCapacity - len;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      if ((local_c0._M_string_length * -0x5555555555555555 + 0xaaaaaaaaaaaaaaaa < 0x5555555555555555
          ) && (local_94 != 2)) {
        std::
        function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_50,
                   (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_a0);
        iVar4 = BacktrackOneCharacter
                          (context,&local_c0,&local_90,iVar4,
                           (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
      }
      while ((local_c0._M_string_length * -0x5555555555555555 + 0x5555555555555555 <
              0x5555555555555555 && ((3 < iVar4 || (local_94 != 1))))) {
        std::
        function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_70,
                   (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_a0);
        iVar4 = BacktrackOneCharacter
                          (context,&local_c0,&local_90,iVar4,
                           (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_70);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      iVar4 = 3;
    }
  } while (iVar4 == 0);
  iVar6 = (int)local_c0._M_string_length;
  iVar4 = (*(int *)&(context->_codewords).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(context->_codewords).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                   .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) + ((int)local_c0._M_string_length / 3) * 2;
  pSVar5 = EncoderContext::updateSymbolInfo(context,iVar4);
  iVar6 = iVar6 % 3;
  if (iVar6 == 2) {
    std::__cxx11::string::push_back((char)&local_c0);
    if (2 < local_c0._M_string_length) {
      do {
        WriteNextTriplet(context,&local_c0);
      } while (2 < local_c0._M_string_length);
    }
LAB_001584ed:
    if ((int)(context->_msg)._M_string_length - context->_skipAtEnd <= context->_pos)
    goto LAB_00158505;
  }
  else {
    iVar4 = pSVar5->_dataCapacity - iVar4;
    if ((iVar6 == 1) && (iVar4 == 1)) {
      if (2 < local_c0._M_string_length) {
        do {
          WriteNextTriplet(context,&local_c0);
        } while (2 < local_c0._M_string_length);
      }
      if (context->_pos < (int)(context->_msg)._M_string_length - context->_skipAtEnd) {
        EncoderContext::addCodeword(context,0xfe);
      }
      context->_pos = context->_pos + -1;
      goto LAB_00158505;
    }
    if (iVar6 != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unexpected case. Please report!");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (2 < local_c0._M_string_length) {
      do {
        WriteNextTriplet(context,&local_c0);
      } while (2 < local_c0._M_string_length);
    }
    if (iVar4 < 1) goto LAB_001584ed;
  }
  EncoderContext::addCodeword(context,0xfe);
LAB_00158505:
  context->_newEncoding = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void EncodeC40(EncoderContext& context, std::function<int (int, std::string&)> encodeChar, int encodingMode)
	{
		//step C
		std::string buffer;
		while (context.hasMoreCharacters()) {
			int c = context.currentChar();
			context.setCurrentPos(context.currentPos() + 1);
			int lastCharSize = encodeChar(c, buffer);
			int unwritten = narrow_cast<int>(buffer.length() / 3) * 2;
			int curCodewordCount = context.codewordCount() + unwritten;
			auto symbolInfo = context.updateSymbolInfo(curCodewordCount);
			int available = symbolInfo->dataCapacity() - curCodewordCount;

			if (!context.hasMoreCharacters()) {
				//Avoid having a single C40 value in the last triplet
				std::string removed;
				if ((buffer.length() % 3) == 2 && available != 2) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				while ((buffer.length() % 3) == 1 && ((lastCharSize <= 3 && available != 1) || lastCharSize > 3)) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				break;
			}

			if ((buffer.length() % 3) == 0) {
				int newMode = LookAheadTest(context.message(), context.currentPos(), encodingMode);
				if (newMode != encodingMode) {
					// Return to ASCII encodation, which will actually handle latch to new mode
					context.setNewEncoding(ASCII_ENCODATION);
					break;
				}
			}
		}
		return HandleEOD(context, buffer);
	}